

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app_parameters.cpp
# Opt level: O2

void __thiscall
jessilib::app_parameters::app_parameters
          (app_parameters *this,int param_1,char **in_argv,char **in_envp,set_type *in_stop_args)

{
  char **in_ntarg_array;
  char **in_ntarg_array_00;
  jessilib *this_00;
  vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  local_70;
  vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  local_58;
  string_type local_40;
  
  get_first_arg<char_const>(&local_40,(jessilib *)in_argv,in_argv);
  if (in_argv == (char **)0x0) {
    this_00 = (jessilib *)0x0;
  }
  else {
    this_00 = (jessilib *)(in_argv + 1);
    if (*in_argv == (char *)0x0) {
      this_00 = (jessilib *)0x0;
    }
  }
  vectorize_ntargs<char8_t,char_const>(&local_58,this_00,in_ntarg_array);
  vectorize_ntargs<char8_t,char_const>(&local_70,(jessilib *)in_envp,in_ntarg_array_00);
  app_parameters(this,&local_40,&local_58,&local_70,in_stop_args);
  std::
  vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::~vector(&local_70);
  std::
  vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::~vector(&local_58);
  std::__cxx11::u8string::~u8string((u8string *)&local_40);
  return;
}

Assistant:

app_parameters::app_parameters(int, const char** in_argv, const char** in_envp, const set_type& in_stop_args)
	: app_parameters{ get_first_arg(in_argv), vectorize_ntargs(get_next_args(in_argv)), vectorize_ntargs(in_envp), in_stop_args } {
	// Empty ctor body
}